

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O0

SignDataType cfd::js::api::ConvertToSignDataType(string *data_type)

{
  bool bVar1;
  CfdException *this;
  allocator local_51;
  string local_50 [32];
  CfdSourceLocation local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *data_type_local;
  
  local_18 = data_type;
  bVar1 = std::operator==(data_type,"sign");
  if (bVar1) {
    data_type_local._4_4_ = kSign;
  }
  else {
    bVar1 = std::operator==(local_18,"binary");
    if (bVar1) {
      data_type_local._4_4_ = kBinary;
    }
    else {
      bVar1 = std::operator==(local_18,"pubkey");
      if (bVar1) {
        data_type_local._4_4_ = kPubkey;
      }
      else {
        bVar1 = std::operator==(local_18,"redeem_script");
        if (bVar1) {
          data_type_local._4_4_ = kRedeemScript;
        }
        else {
          bVar1 = std::operator==(local_18,"op_code");
          if (!bVar1) {
            local_30.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction_base.cpp"
                         ,0x2f);
            local_30.filename = local_30.filename + 1;
            local_30.line = 0x3e;
            local_30.funcname = "ConvertToSignDataType";
            core::logger::warn<std::__cxx11::string_const&>
                      (&local_30,
                       "Failed to ConvertToSignDataType. Invalid data_type string passed. data_type=[{}]"
                       ,local_18);
            this = (CfdException *)__cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_50,"Sign data type convert error. Invalid data_type string passed.",
                       &local_51);
            core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_50);
            __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          data_type_local._4_4_ = kOpCode;
        }
      }
    }
  }
  return data_type_local._4_4_;
}

Assistant:

static SignDataType ConvertToSignDataType(const std::string& data_type) {
  if (data_type == "sign") {
    return SignDataType::kSign;
  } else if (data_type == "binary") {
    return SignDataType::kBinary;
  } else if (data_type == "pubkey") {
    return SignDataType::kPubkey;
  } else if (data_type == "redeem_script") {
    return SignDataType::kRedeemScript;
  } else if (data_type == "op_code") {
    return SignDataType::kOpCode;
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to ConvertToSignDataType. Invalid data_type string passed. "
        "data_type=[{}]",
        data_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Sign data type convert error. Invalid data_type string passed.");
  }
}